

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

int htmlEncodeEntities(uchar *out,int *outlen,uchar *in,int *inlen,int quoteChar)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  htmlEntityDesc *phVar8;
  size_t sVar9;
  int *piVar10;
  char local_98 [4];
  int len;
  char nbuf [16];
  char *local_80;
  char *cp;
  htmlEntityDesc *ent;
  int trailing;
  uint d;
  uint c;
  uchar *inend;
  uchar *instart;
  uchar *outstart;
  uchar *outend;
  uchar *processed;
  int quoteChar_local;
  int *inlen_local;
  uchar *in_local;
  int *outlen_local;
  uchar *out_local;
  
  if ((((out == (uchar *)0x0) || (outlen == (int *)0x0)) || (inlen == (int *)0x0)) ||
     (in == (uchar *)0x0)) {
    out_local._4_4_ = -1;
  }
  else {
    iVar1 = *outlen;
    iVar2 = *inlen;
    inlen_local = (int *)in;
    outlen_local = (int *)out;
    while( true ) {
      iVar3 = (int)outlen_local;
      iVar4 = (int)out;
      iVar5 = (int)inlen_local;
      iVar6 = (int)in;
      if (in + iVar2 <= inlen_local) break;
      piVar10 = (int *)((long)inlen_local + 1);
      trailing = (int)(byte)*inlen_local;
      if ((uint)trailing < 0x80) {
        ent._4_4_ = 0;
      }
      else {
        if ((uint)trailing < 0xc0) {
          *outlen = iVar3 - iVar4;
          *inlen = iVar5 - iVar6;
          return -2;
        }
        if ((uint)trailing < 0xe0) {
          trailing = trailing & 0x1f;
          ent._4_4_ = 1;
        }
        else if ((uint)trailing < 0xf0) {
          trailing = trailing & 0xf;
          ent._4_4_ = 2;
        }
        else {
          if (0xf7 < (uint)trailing) {
            *outlen = iVar3 - iVar4;
            *inlen = iVar5 - iVar6;
            return -2;
          }
          trailing = trailing & 7;
          ent._4_4_ = 3;
        }
      }
      inlen_local = piVar10;
      if ((long)(in + iVar2) - (long)piVar10 < (long)ent._4_4_) break;
      while (ent._4_4_ != 0) {
        if (((byte)*inlen_local & 0xc0) != 0x80) {
          *outlen = iVar3 - iVar4;
          *inlen = iVar5 - iVar6;
          return -2;
        }
        trailing = (byte)*inlen_local & 0x3f | trailing << 6;
        ent._4_4_ = ent._4_4_ + -1;
        inlen_local = (int *)((long)inlen_local + 1);
      }
      if ((((uint)trailing < 0x80) && (trailing != quoteChar)) &&
         ((trailing != 0x26 && ((trailing != 0x3c && (trailing != 0x3e)))))) {
        if (out + iVar1 <= outlen_local) break;
        *(char *)outlen_local = (char)trailing;
      }
      else {
        phVar8 = htmlEntityValueLookup(trailing);
        if (phVar8 == (htmlEntityDesc *)0x0) {
          snprintf(local_98,0x10,"#%u",(ulong)(uint)trailing);
          local_80 = local_98;
        }
        else {
          local_80 = phVar8->name;
        }
        sVar9 = strlen(local_80);
        iVar7 = (int)sVar9;
        if (out + iVar1 < (int *)((long)outlen_local + (long)iVar7 + 2)) break;
        *(undefined1 *)outlen_local = 0x26;
        memcpy((void *)((long)outlen_local + 1),local_80,(long)iVar7);
        outlen_local = (int *)((long)outlen_local + 1 + (long)iVar7);
        *(undefined1 *)outlen_local = 0x3b;
      }
      outlen_local = (int *)((long)outlen_local + 1);
    }
    *outlen = iVar3 - iVar4;
    *inlen = iVar5 - iVar6;
    out_local._4_4_ = 0;
  }
  return out_local._4_4_;
}

Assistant:

int
htmlEncodeEntities(unsigned char* out, int *outlen,
		   const unsigned char* in, int *inlen, int quoteChar) {
    const unsigned char* processed = in;
    const unsigned char* outend;
    const unsigned char* outstart = out;
    const unsigned char* instart = in;
    const unsigned char* inend;
    unsigned int c, d;
    int trailing;

    if ((out == NULL) || (outlen == NULL) || (inlen == NULL) || (in == NULL))
        return(-1);
    outend = out + (*outlen);
    inend = in + (*inlen);
    while (in < inend) {
	d = *in++;
	if      (d < 0x80)  { c= d; trailing= 0; }
	else if (d < 0xC0) {
	    /* trailing byte in leading position */
	    *outlen = out - outstart;
	    *inlen = processed - instart;
	    return(-2);
        } else if (d < 0xE0)  { c= d & 0x1F; trailing= 1; }
        else if (d < 0xF0)  { c= d & 0x0F; trailing= 2; }
        else if (d < 0xF8)  { c= d & 0x07; trailing= 3; }
	else {
	    /* no chance for this in Ascii */
	    *outlen = out - outstart;
	    *inlen = processed - instart;
	    return(-2);
	}

	if (inend - in < trailing)
	    break;

	while (trailing--) {
	    if (((d= *in++) & 0xC0) != 0x80) {
		*outlen = out - outstart;
		*inlen = processed - instart;
		return(-2);
	    }
	    c <<= 6;
	    c |= d & 0x3F;
	}

	/* assertion: c is a single UTF-4 value */
	if ((c < 0x80) && (c != (unsigned int) quoteChar) &&
	    (c != '&') && (c != '<') && (c != '>')) {
	    if (out >= outend)
		break;
	    *out++ = c;
	} else {
	    const htmlEntityDesc * ent;
	    const char *cp;
	    char nbuf[16];
	    int len;

	    /*
	     * Try to lookup a predefined HTML entity for it
	     */
	    ent = htmlEntityValueLookup(c);
	    if (ent == NULL) {
		snprintf(nbuf, sizeof(nbuf), "#%u", c);
		cp = nbuf;
	    }
	    else
		cp = ent->name;
	    len = strlen(cp);
	    if (out + 2 + len > outend)
		break;
	    *out++ = '&';
	    memcpy(out, cp, len);
	    out += len;
	    *out++ = ';';
	}
	processed = in;
    }
    *outlen = out - outstart;
    *inlen = processed - instart;
    return(0);
}